

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

INT32 __thiscall PlayerA::CalcSongVolume(PlayerA *this)

{
  int iVar1;
  undefined1 local_34 [7];
  UINT8 retVal;
  PLR_SONG_INFO songInfo;
  INT32 volume;
  PlayerA *this_local;
  
  songInfo.volGain = (this->_config).masterVol;
  if (((((this->_config).ignoreVolGain & 1U) == 0) && (this->_player != (PlayerBase *)0x0)) &&
     (unique0x10000085 = this, iVar1 = (*this->_player->_vptr_PlayerBase[8])(this->_player,local_34)
     , (char)iVar1 == '\0')) {
    songInfo.volGain =
         (INT32)((ulong)((long)songInfo.volGain * (long)(int)songInfo.songLen) >> 0x10);
  }
  return songInfo.volGain;
}

Assistant:

INT32 PlayerA::CalcSongVolume(void)
{
	INT32 volume = _config.masterVol;
	
	if (! _config.ignoreVolGain && _player != NULL)
	{
		PLR_SONG_INFO songInfo;
		UINT8 retVal = _player->GetSongInfo(songInfo);
		if (! retVal)
			volume = MUL16X16_FIXED(volume, songInfo.volGain);
	}
	
	return volume;
}